

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectTopXors(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  Gia_Obj_t *pGStack_70;
  int fCompl;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pFan [2];
  Vec_Int_t *vOrder;
  Vec_Int_t *vPart [2];
  Vec_Int_t *vXors;
  int Count1;
  int fFlip;
  int iObj2;
  int iObj;
  int i;
  Gia_Man_t *p_local;
  
  pGStack_70 = Gia_ManCo(p,0);
  pVVar4 = Vec_IntAlloc(100);
  iVar2 = Gia_ManCoNum(p);
  if (iVar2 == 1) {
    iVar2 = Gia_ObjFaninC0(pGStack_70);
    if (iVar2 == 0) {
      pGVar5 = Gia_ObjFanin0(pGStack_70);
      iVar2 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(pVVar4,iVar2);
    }
    else {
      pGVar5 = Gia_ObjFanin0(pGStack_70);
      Gia_ManCollectTopXors_rec(p,pGVar5,pVVar4);
    }
  }
  else {
    iObj2 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (iObj2 < iVar2) {
        pGStack_70 = Gia_ManCo(p,iObj2);
        bVar6 = pGStack_70 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjFaninId0p(p,pGStack_70);
      if (0 < iVar2) {
        iVar2 = Gia_ObjFaninId0p(p,pGStack_70);
        Vec_IntPush(pVVar4,iVar2);
      }
      iObj2 = iObj2 + 1;
    }
  }
  Gia_ManDupDemiterOrderXors(p,pVVar4);
  Vec_IntReverseOrder(pVVar4);
  Gia_ManCleanMark01(p);
  vOrder = Vec_IntAlloc(100);
  vPart[0] = Vec_IntAlloc(100);
  iObj2 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pVVar4);
    bVar6 = false;
    if (iObj2 < iVar2) {
      iVar2 = Vec_IntEntry(pVVar4,iObj2);
      pGStack_70 = Gia_ManObj(p,iVar2);
      bVar6 = pGStack_70 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjRecognizeExor(pGStack_70,&pObj,pFan);
    if (iVar2 == 0) {
      pObj = pGStack_70;
      pFan[0] = Gia_ManConst0(p);
    }
    else {
      Gia_IsComplement(pObj);
      Gia_IsComplement(pFan[0]);
      pObj = Gia_Regular(pObj);
      pFan[0] = Gia_Regular(pFan[0]);
    }
    iVar2 = Gia_ManDecideWhereToAdd(p,&vOrder,&pObj);
    pVVar1 = vOrder;
    iVar3 = Gia_ObjId(p,pFan[(long)iVar2 + -1]);
    Vec_IntPush(pVVar1,iVar3);
    pVVar1 = vPart[0];
    iVar3 = Gia_ObjId(p,pFan[(long)(int)(uint)((iVar2 != 0 ^ 0xffU) & 1) + -1]);
    Vec_IntPush(pVVar1,iVar3);
    iVar3 = Gia_ObjId(p,pFan[(long)iVar2 + -1]);
    Gia_ManSetMark0Dfs_rec(p,iVar3);
    iVar2 = Gia_ObjId(p,pFan[(long)(int)(uint)((iVar2 != 0 ^ 0xffU) & 1) + -1]);
    Gia_ManSetMark1Dfs_rec(p,iVar2);
    iObj2 = iObj2 + 1;
  }
  Vec_IntFree(pVVar4);
  Gia_ManCleanMark01(p);
  pVVar4 = Vec_IntAlloc(100);
  for (iObj2 = 0; iVar2 = Vec_IntSize(vOrder), iObj2 < iVar2; iObj2 = iObj2 + 1) {
    iVar2 = Vec_IntEntry(vOrder,iObj2);
    iVar3 = Vec_IntEntry(vPart[0],iObj2);
    Vec_IntPushTwo(pVVar4,iVar2,iVar3);
  }
  Vec_IntFree(vOrder);
  Vec_IntFree(vPart[0]);
  Vec_IntReverseOrder(pVVar4);
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManCollectTopXors( Gia_Man_t * p )
{
    int i, iObj, iObj2, fFlip, Count1 = 0;
    Vec_Int_t * vXors, * vPart[2], * vOrder; 
    Gia_Obj_t * pFan[2], * pObj = Gia_ManCo(p, 0);
    vXors = Vec_IntAlloc( 100 );
    if ( Gia_ManCoNum(p) == 1 )
    {
        if ( Gia_ObjFaninC0(pObj) )
            Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
        else
            Vec_IntPush( vXors, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjFaninId0p(p, pObj) > 0 )
                Vec_IntPush( vXors, Gia_ObjFaninId0p(p, pObj) );
    }
    // order by support size
    Gia_ManDupDemiterOrderXors( p, vXors );
    //Vec_IntPrint( vXors );
    Vec_IntReverseOrder( vXors ); // from MSB to LSB
    // divide into groups
    Gia_ManCleanMark01(p);
    vPart[0] = Vec_IntAlloc( 100 );
    vPart[1] = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vXors, p, pObj, i )
    {
        int fCompl = 0;
        if ( !Gia_ObjRecognizeExor(pObj, &pFan[0], &pFan[1]) )
            pFan[0] = pObj, pFan[1] = Gia_ManConst0(p), Count1++;
        else
        {
            fCompl ^= Gia_IsComplement(pFan[0]);
            fCompl ^= Gia_IsComplement(pFan[1]);
            pFan[0] = Gia_Regular(pFan[0]);
            pFan[1] = Gia_Regular(pFan[1]);
        }
        fFlip = Gia_ManDecideWhereToAdd( p, vPart, pFan );
        Vec_IntPush( vPart[0], Gia_ObjId(p, pFan[fFlip]) );
        Vec_IntPush( vPart[1], Gia_ObjId(p, pFan[!fFlip]) );
        Gia_ManSetMark0Dfs_rec( p, Gia_ObjId(p, pFan[fFlip]) );
        Gia_ManSetMark1Dfs_rec( p, Gia_ObjId(p, pFan[!fFlip]) );
    }
    //printf( "Detected %d single-output XOR miters and %d other miters.\n", Vec_IntSize(vXors) - Count1, Count1 );
    Vec_IntFree( vXors );
    Gia_ManCleanMark01(p);
    // create new order
    vOrder = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryTwo( vPart[0], vPart[1], iObj, iObj2, i )
        Vec_IntPushTwo( vOrder, iObj, iObj2 );
    Vec_IntFree( vPart[0] );
    Vec_IntFree( vPart[1] );
    Vec_IntReverseOrder( vOrder ); // from LSB to MSB
    //Vec_IntPrint( vOrder );
    return vOrder;
}